

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar2 = (window->Pos).x;
  fVar3 = (window->Pos).y;
  fVar6 = (window->Size).x + fVar2;
  fVar7 = (window->Size).y + fVar3;
  fVar8 = (*corner_target).x;
  fVar9 = (*corner_target).y;
  fVar4 = (fVar2 - in_XMM0_Da) * fVar8 + in_XMM0_Da;
  fVar5 = (fVar3 - in_XMM1_Da) * fVar9 + in_XMM1_Da;
  fVar2 = ((in_XMM0_Da - fVar6) * fVar8 + fVar6) - fVar4;
  fVar3 = ((in_XMM1_Da - fVar7) * fVar9 + fVar7) - fVar5;
  IVar1 = CalcWindowSizeAfterConstraint(window,(ImVec2 *)CONCAT44(fVar3,fVar2));
  corner_norm->x = fVar4;
  corner_norm->y = fVar5;
  if ((corner_target->x == 0.0) && (!NAN(corner_target->x))) {
    corner_norm->x = fVar4 - (IVar1.x - fVar2);
  }
  if ((corner_target->y == 0.0) && (!NAN(corner_target->y))) {
    corner_norm->y = fVar5 - (IVar1.y - fVar3);
  }
  *out_pos = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}